

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket.cpp
# Opt level: O0

void __thiscall QLocalSocket::setSocketOptions(QLocalSocket *this,SocketOptions option)

{
  long lVar1;
  QLocalSocketPrivate *this_00;
  char *in_RDI;
  long in_FS_OFFSET;
  QLocalSocketPrivate *d;
  parameter_type in_stack_ffffffffffffffb8;
  QMessageLogger *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QLocalSocket *)0x381899);
  if (this_00->state == UnconnectedState) {
    QObjectBindableProperty<QLocalSocketPrivate,_QFlags<QLocalSocket::SocketOption>,_&QLocalSocketPrivate::_qt_property_socketOptions_offset,_nullptr>
    ::operator=((QObjectBindableProperty<QLocalSocketPrivate,_QFlags<QLocalSocket::SocketOption>,_&QLocalSocketPrivate::_qt_property_socketOptions_offset,_nullptr>
                 *)this_00,in_stack_ffffffffffffffb8);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffd0,in_RDI,(int)((ulong)this_00 >> 0x20),
               (char *)in_stack_ffffffffffffffb8);
    QMessageLogger::warning
              (&stack0xffffffffffffffd0,
               "QLocalSocket::setSocketOptions() called while not in unconnected state");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLocalSocket::setSocketOptions(QLocalSocket::SocketOptions option)
{
    Q_D(QLocalSocket);
    if (d->state != UnconnectedState) {
        qWarning("QLocalSocket::setSocketOptions() called while not in unconnected state");
        return;
    }
    d->socketOptions = option;
}